

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int nocaseCollatingFunc(void *NotUsed,int nKey1,void *pKey1,int nKey2,void *pKey2)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  
  iVar2 = nKey2;
  if (nKey1 < nKey2) {
    iVar2 = nKey1;
  }
  if (0 < iVar2) {
    uVar3 = iVar2 + 1;
    lVar4 = 0;
    do {
      if ((ulong)*(byte *)((long)pKey1 + lVar4) == 0) {
        bVar1 = ""[*(byte *)((long)pKey2 + lVar4)];
        uVar5 = 0;
LAB_00178ba6:
        if (uVar5 - bVar1 != 0) {
          return uVar5 - bVar1;
        }
        return nKey1 - nKey2;
      }
      uVar5 = (uint)""[*(byte *)((long)pKey1 + lVar4)];
      bVar1 = ""[*(byte *)((long)pKey2 + lVar4)];
      if (""[*(byte *)((long)pKey1 + lVar4)] != bVar1) goto LAB_00178ba6;
      uVar3 = uVar3 - 1;
      lVar4 = lVar4 + 1;
    } while (1 < uVar3);
  }
  return nKey1 - nKey2;
}

Assistant:

static int nocaseCollatingFunc(
  void *NotUsed,
  int nKey1, const void *pKey1,
  int nKey2, const void *pKey2
){
  int r = sqlite3StrNICmp(
      (const char *)pKey1, (const char *)pKey2, (nKey1<nKey2)?nKey1:nKey2);
  UNUSED_PARAMETER(NotUsed);
  if( 0==r ){
    r = nKey1-nKey2;
  }
  return r;
}